

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeTransferError(Vdbe *p)

{
  u8 uVar1;
  int iVar2;
  sqlite3 *db;
  Mem *p_00;
  sqlite3_value *pMem;
  
  db = p->db;
  iVar2 = p->rc;
  if (p->zErrMsg == (char *)0x0) {
    db->errCode = iVar2;
    p_00 = db->pErr;
    if (p_00 == (Mem *)0x0) {
      return iVar2;
    }
    if ((p_00->flags & 0x2460) != 0) {
      vdbeMemClearExternAndSetNull(p_00);
      return iVar2;
    }
    p_00->flags = 1;
    return iVar2;
  }
  uVar1 = db->mallocFailed;
  if (sqlite3Hooks_0 != (code *)0x0) {
    (*sqlite3Hooks_0)();
  }
  pMem = db->pErr;
  if (pMem == (sqlite3_value *)0x0) {
    pMem = (sqlite3_value *)sqlite3DbMallocRaw(db,0x38);
    if (pMem == (sqlite3_value *)0x0) {
      db->pErr = (sqlite3_value *)0x0;
      goto LAB_0012899f;
    }
    (pMem->u).r = 0.0;
    pMem->flags = 0;
    pMem->enc = '\0';
    pMem->field_0xb = 0;
    pMem->n = 0;
    pMem->szMalloc = 0;
    pMem->uTemp = 0;
    pMem->db = (sqlite3 *)0x0;
    pMem->z = (char *)0x0;
    pMem->zMalloc = (char *)0x0;
    pMem->xDel = (_func_void_void_ptr *)0x0;
    pMem->flags = 1;
    pMem->db = db;
    db->pErr = pMem;
  }
  sqlite3VdbeMemSetStr(pMem,p->zErrMsg,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
LAB_0012899f:
  if (sqlite3Hooks_1 != (code *)0x0) {
    (*sqlite3Hooks_1)();
  }
  db->mallocFailed = uVar1;
  db->errCode = iVar2;
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeTransferError(Vdbe *p){
  sqlite3 *db = p->db;
  int rc = p->rc;
  if( p->zErrMsg ){
    u8 mallocFailed = db->mallocFailed;
    sqlite3BeginBenignMalloc();
    if( db->pErr==0 ) db->pErr = sqlite3ValueNew(db);
    sqlite3ValueSetStr(db->pErr, -1, p->zErrMsg, SQLITE_UTF8, SQLITE_TRANSIENT);
    sqlite3EndBenignMalloc();
    db->mallocFailed = mallocFailed;
    db->errCode = rc;
  }else{
    sqlite3Error(db, rc);
  }
  return rc;
}